

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

void sha512_final(ptls_hash_context_t *_ctx,void *md,ptls_hash_final_mode_t mode)

{
  undefined1 local_100 [8];
  SHA512_CTX copy;
  sha512_context_t_conflict *ctx;
  ptls_hash_final_mode_t mode_local;
  void *md_local;
  ptls_hash_context_t *_ctx_local;
  
  copy._208_8_ = _ctx;
  if (mode == PTLS_HASH_FINAL_MODE_SNAPSHOT) {
    memcpy(local_100,_ctx + 1,0xd8);
    SHA512_Final((uchar *)md,(SHA512_CTX *)local_100);
    (*ptls_clear_memory)(local_100,0xd8);
  }
  else {
    if (md != (void *)0x0) {
      SHA512_Final((uchar *)md,(SHA512_CTX *)(_ctx + 1));
    }
    if (mode == PTLS_HASH_FINAL_MODE_FREE) {
      (*ptls_clear_memory)((void *)(copy._208_8_ + 0x18),0xd8);
      free((void *)copy._208_8_);
    }
    else {
      if (mode != PTLS_HASH_FINAL_MODE_RESET) {
        __assert_fail("!\"FIXME\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/openssl.c"
                      ,0x5d1,
                      "void sha512_final(ptls_hash_context_t *, void *, ptls_hash_final_mode_t)");
      }
      SHA512_Init((SHA512_CTX *)(copy._208_8_ + 0x18));
    }
  }
  return;
}

Assistant:

static int sign_certificate(ptls_sign_certificate_t *_self, ptls_t *tls, ptls_async_job_t **async, uint16_t *selected_algorithm,
                            ptls_buffer_t *outbuf, ptls_iovec_t input, const uint16_t *algorithms, size_t num_algorithms)
{
    ptls_openssl_sign_certificate_t *self = (ptls_openssl_sign_certificate_t *)_self;
    const ptls_openssl_signature_scheme_t *scheme;

    /* Just resume the asynchronous operation, if one is in flight. */
#if PTLS_OPENSSL_HAVE_ASYNC
    if (async != NULL && *async != NULL) {
        struct async_sign_ctx *sign_ctx = (struct async_sign_ctx *)(*async);
        *selected_algorithm = sign_ctx->scheme->scheme_id;
        return do_sign_async(outbuf, async);
    }
#endif

    /* Select the algorithm or return failure if none found. */
    if ((scheme = ptls_openssl_select_signature_scheme(self->schemes, algorithms, num_algorithms)) == NULL)
        return PTLS_ALERT_HANDSHAKE_FAILURE;
    *selected_algorithm = scheme->scheme_id;

#if PTLS_OPENSSL_HAVE_ASYNC
    if (!self->async && async != NULL) {
        /* indicate to `do_sign` that async mode is disabled for this operation */
        assert(*async == NULL);
        async = NULL;
    }
#endif
    return do_sign(self->key, scheme, outbuf, input, async);
}